

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel_oaa.cc
# Opt level: O0

void predict_or_learn<false>(multi_oaa *o,single_learner *base,example *ec)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long in_RDX;
  ulong *in_RDI;
  uint32_t i;
  uint32_t multilabel_index;
  labels preds;
  labels multilabels;
  uint *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  
  uVar1 = *(undefined8 *)(in_RDX + 0x6828);
  uVar2 = *(undefined8 *)(in_RDX + 0x6830);
  uVar3 = *(undefined8 *)(in_RDX + 0x6838);
  uVar4 = *(undefined8 *)(in_RDX + 0x6840);
  uVar5 = *(undefined8 *)(in_RDX + 0x6850);
  uVar6 = *(undefined8 *)(in_RDX + 0x6858);
  uVar7 = *(undefined8 *)(in_RDX + 0x6860);
  uVar8 = *(undefined8 *)(in_RDX + 0x6868);
  v_array<unsigned_int>::clear
            ((v_array<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
  ;
  uVar11 = 0x7f7fffff;
  uVar12 = 0x3f800000;
  uVar13 = 0;
  *(undefined8 *)(in_RDX + 0x6828) = 0x3f8000007f7fffff;
  *(undefined4 *)(in_RDX + 0x6830) = 0;
  uVar10 = 0;
  for (uVar9 = 0; (ulong)uVar9 < *in_RDI; uVar9 = uVar9 + 1) {
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)CONCAT44(uVar13,uVar12),(example *)CONCAT44(uVar11,uVar10),
               CONCAT44(uVar9,in_stack_ffffffffffffff90));
    if (0.0 < *(float *)(in_RDX + 0x6850)) {
      v_array<unsigned_int>::push_back
                ((v_array<unsigned_int> *)CONCAT44(uVar9,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
    }
  }
  *(undefined8 *)(in_RDX + 0x6850) = uVar5;
  *(undefined8 *)(in_RDX + 0x6858) = uVar6;
  *(undefined8 *)(in_RDX + 0x6860) = uVar7;
  *(undefined8 *)(in_RDX + 0x6868) = uVar8;
  *(undefined8 *)(in_RDX + 0x6828) = uVar1;
  *(undefined8 *)(in_RDX + 0x6830) = uVar2;
  *(undefined8 *)(in_RDX + 0x6838) = uVar3;
  *(undefined8 *)(in_RDX + 0x6840) = uVar4;
  return;
}

Assistant:

void predict_or_learn(multi_oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTILABEL::labels multilabels = ec.l.multilabels;
  MULTILABEL::labels preds = ec.pred.multilabels;
  preds.label_v.clear();

  ec.l.simple = {FLT_MAX, 1.f, 0.f};
  uint32_t multilabel_index = 0;
  for (uint32_t i = 0; i < o.k; i++)
  {
    if (is_learn)
    {
      ec.l.simple.label = -1.f;
      if (multilabels.label_v.size() > multilabel_index && multilabels.label_v[multilabel_index] == i)
      {
        ec.l.simple.label = 1.f;
        multilabel_index++;
      }
      base.learn(ec, i);
    }
    else
      base.predict(ec, i);
    if (ec.pred.scalar > 0.)
      preds.label_v.push_back(i);
  }
  if (is_learn && multilabel_index < multilabels.label_v.size())
    cout << "label " << multilabels.label_v[multilabel_index] << " is not in {0," << o.k - 1
         << "} This won't work right." << endl;

  ec.pred.multilabels = preds;
  ec.l.multilabels = multilabels;
}